

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O0

bool __thiscall
crnlib::lzma_codec::unpack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  LzmaUncompressFuncPtr p_Var1;
  header *this_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uStack_50;
  int status;
  size_t destLen;
  size_t srcLen;
  uint8 *pComp_data;
  header *hdr;
  vector<unsigned_char> *buf_local;
  packed_uint *ppStack_20;
  uint n_local;
  void *p_local;
  lzma_codec *this_local;
  
  hdr = (header *)buf;
  buf_local._4_4_ = n;
  ppStack_20 = (packed_uint *)p;
  p_local = this;
  vector<unsigned_char>::resize(buf,0,false);
  if (buf_local._4_4_ < 0x14) {
    this_local._7_1_ = false;
  }
  else {
    pComp_data = (uint8 *)ppStack_20;
    uVar3 = packed_uint::operator_cast_to_unsigned_int(ppStack_20);
    if (uVar3 == 0x304c) {
      uVar4 = adler32(pComp_data + 3,0x11,1);
      if ((uVar4 & 0xff) == (uint)pComp_data[2]) {
        uVar3 = packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pComp_data + 0xc));
        if (uVar3 == 0) {
          this_local._7_1_ = true;
        }
        else {
          uVar3 = packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pComp_data + 8));
          if (uVar3 == 0) {
            this_local._7_1_ = false;
          }
          else {
            uVar3 = packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pComp_data + 0xc));
            this_00 = hdr;
            if (uVar3 < 0x40000001) {
              uVar3 = packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pComp_data + 0xc));
              bVar2 = vector<unsigned_char>::try_resize
                                ((vector<unsigned_char> *)this_00,uVar3,false);
              if (bVar2) {
                srcLen = (size_t)(ppStack_20 + 0x14);
                uVar6 = (ulong)buf_local._4_4_;
                destLen = uVar6 - 0x14;
                uVar3 = packed_uint::operator_cast_to_unsigned_int((packed_uint *)(pComp_data + 8));
                if (uVar6 - 0x14 < (ulong)uVar3) {
                  this_local._7_1_ = false;
                }
                else {
                  uVar3 = packed_uint::operator_cast_to_unsigned_int
                                    ((packed_uint *)(pComp_data + 0xc));
                  uStack_50 = (ulong)uVar3;
                  p_Var1 = this->m_pUncompress;
                  puVar7 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)hdr,0);
                  iVar5 = (*p_Var1)(puVar7,&stack0xffffffffffffffb0,(uchar *)srcLen,&destLen,
                                    pComp_data + 3,5);
                  uVar6 = uStack_50;
                  if ((iVar5 == 0) &&
                     (uVar3 = packed_uint::operator_cast_to_unsigned_int
                                        ((packed_uint *)(pComp_data + 0xc)), uVar6 == uVar3)) {
                    puVar7 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)hdr,0);
                    uVar4 = vector<unsigned_char>::size((vector<unsigned_char> *)hdr);
                    uVar4 = adler32(puVar7,(ulong)uVar4,1);
                    uVar3 = packed_uint::operator_cast_to_unsigned_int
                                      ((packed_uint *)(pComp_data + 0x10));
                    if (uVar4 != uVar3) {
                      vector<unsigned_char>::clear((vector<unsigned_char> *)hdr);
                      return false;
                    }
                    return true;
                  }
                  vector<unsigned_char>::clear((vector<unsigned_char> *)hdr);
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool lzma_codec::unpack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        buf.resize(0);

        if (n < sizeof(header))
        {
            return false;
        }

        const header& hdr = *static_cast<const header*>(p);
        if (hdr.m_sig != header::cSig)
        {
            return false;
        }

        if (static_cast<uint8>(adler32((const uint8*)&hdr + header::cChecksumSkipBytes, sizeof(hdr) - header::cChecksumSkipBytes)) != hdr.m_checksum)
        {
            return false;
        }

        if (!hdr.m_uncomp_size)
        {
            return true;
        }

        if (!hdr.m_comp_size)
        {
            return false;
        }

        if (hdr.m_uncomp_size > 1024U * 1024U * 1024U)
        {
            return false;
        }

        if (!buf.try_resize(hdr.m_uncomp_size))
        {
            return false;
        }

        const uint8* pComp_data = static_cast<const uint8*>(p) + sizeof(header);
        size_t srcLen = n - sizeof(header);
        if (srcLen < hdr.m_comp_size)
        {
            return false;
        }

        size_t destLen = hdr.m_uncomp_size;

        int status = (*m_pUncompress)(&buf[0], &destLen, pComp_data, &srcLen, hdr.m_lzma_props, cLZMAPropsSize);

        if ((status != SZ_OK) || (destLen != hdr.m_uncomp_size))
        {
            buf.clear();
            return false;
        }

        if (adler32(&buf[0], buf.size()) != hdr.m_adler32)
        {
            buf.clear();
            return false;
        }

        return true;
    }